

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqstdrex.cpp
# Opt level: O1

SQChar * sqstd_rex_matchnode(SQRex *exp,SQRexNode *node,SQChar *str,SQRexNode *next)

{
  char c;
  long lVar1;
  SQInteger SVar2;
  SQRexMatch *pSVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  SQBool SVar7;
  SQChar *pSVar8;
  SQChar *pSVar9;
  ulong uVar10;
  SQRexNode *pSVar11;
  char *pcVar12;
  long lVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  SQRexNode *pSVar17;
  bool bVar18;
  
  iVar5 = node->type;
  switch(iVar5) {
  case 0x100:
    uVar14 = node->right & 0xffff;
    uVar10 = (ulong)node->right >> 0x10 & 0xffff;
    pSVar17 = next;
    if (node->next != -1) {
      pSVar17 = exp->_nodes + node->next;
    }
    pSVar9 = str;
    uVar16 = 0;
    do {
      uVar15 = uVar16;
      if ((long)uVar14 <= (long)uVar16 && uVar16 != 0xffff) break;
      pSVar9 = sqstd_rex_matchnode(exp,exp->_nodes + node->left,pSVar9,pSVar17);
      if (pSVar9 == (SQChar *)0x0) {
        bVar18 = true;
      }
      else {
        uVar15 = uVar16 + 1;
        str = pSVar9;
        if ((pSVar17 != (SQRexNode *)0x0) &&
           ((pSVar17->type != 0x100 || (*(short *)((long)&pSVar17->right + 2) != 0)))) {
          lVar13 = pSVar17->next;
          if ((lVar13 == -1) && ((next == (SQRexNode *)0x0 || (lVar13 = next->next, lVar13 == -1))))
          {
            pSVar11 = (SQRexNode *)0x0;
          }
          else {
            pSVar11 = exp->_nodes + lVar13;
          }
          pSVar8 = sqstd_rex_matchnode(exp,pSVar17,pSVar9,pSVar11);
          if (pSVar8 == (SQChar *)0x0) {
LAB_0012ea8c:
            bVar18 = false;
            bVar4 = true;
          }
          else {
            bVar18 = true;
            if (uVar10 != uVar15 || uVar10 != uVar14) {
              if (((long)uVar15 < (long)uVar10) ||
                 (uVar14 != 0xffff && (long)uVar14 <= (long)uVar16)) goto LAB_0012ea8c;
            }
            bVar4 = false;
          }
          if (!bVar4) goto LAB_0012eaa2;
        }
        bVar18 = exp->_eol <= pSVar9;
      }
LAB_0012eaa2:
      uVar16 = uVar15;
    } while (!bVar18);
    pSVar9 = str;
    if ((uVar10 != uVar15 || uVar10 != uVar14) && ((long)uVar15 < (long)uVar10 || uVar14 != 0xffff))
    {
      if ((long)uVar14 < (long)uVar15) {
        str = (SQChar *)0x0;
      }
      pSVar9 = str;
      if ((long)uVar15 < (long)uVar10) {
        pSVar9 = (SQChar *)0x0;
      }
    }
    break;
  case 0x101:
    pSVar17 = exp->_nodes + node->left;
    for (pSVar9 = sqstd_rex_matchnode(exp,pSVar17,str,(SQRexNode *)0x0); pSVar9 != (SQChar *)0x0;
        pSVar9 = sqstd_rex_matchnode(exp,pSVar17,pSVar9,(SQRexNode *)0x0)) {
      if (pSVar17->next == -1) {
        return pSVar9;
      }
      pSVar17 = exp->_nodes + pSVar17->next;
    }
    pSVar17 = exp->_nodes + node->right;
    pSVar8 = sqstd_rex_matchnode(exp,pSVar17,str,(SQRexNode *)0x0);
    pSVar9 = (SQChar *)0x0;
    if (pSVar8 != (SQChar *)0x0) {
      do {
        if (pSVar17->next == -1) {
          return pSVar8;
        }
        pSVar17 = exp->_nodes + pSVar17->next;
        pSVar8 = sqstd_rex_matchnode(exp,pSVar17,pSVar8,(SQRexNode *)0x0);
        pSVar9 = (SQChar *)0x0;
      } while (pSVar8 != (SQChar *)0x0);
    }
    break;
  case 0x102:
  case 0x103:
    pSVar17 = exp->_nodes + node->left;
    lVar13 = -1;
    if ((iVar5 != 0x103) && (lVar1 = exp->_currsubexp, node->right == lVar1)) {
      exp->_matches[lVar1].begin = str;
      exp->_currsubexp = lVar1 + 1;
      lVar13 = lVar1;
    }
    SVar2 = exp->_currsubexp;
    do {
      pSVar11 = next;
      if (pSVar17->next != -1) {
        pSVar11 = exp->_nodes + pSVar17->next;
      }
      str = sqstd_rex_matchnode(exp,pSVar17,str,pSVar11);
      if (str == (SQChar *)0x0) {
        if (lVar13 != -1) {
          pSVar3 = exp->_matches;
          pSVar3[lVar13].begin = (SQChar *)0x0;
          pSVar3[lVar13].len = 0;
        }
        goto LAB_0012ebc9;
      }
    } while ((pSVar17->next != -1) &&
            (pSVar17 = exp->_nodes + pSVar17->next, exp->_nodes != (SQRexNode *)0x0));
    exp->_currsubexp = SVar2;
    pSVar9 = str;
    if (lVar13 != -1) {
      exp->_matches[lVar13].len = (long)str - (long)exp->_matches[lVar13].begin;
    }
    break;
  case 0x104:
    pSVar9 = (SQChar *)0x0;
    if (exp->_eol != str) {
      pSVar9 = str + 1;
    }
    break;
  case 0x105:
  case 0x107:
    if (exp->_eol != str) {
      pSVar17 = exp->_nodes;
      lVar13 = node->left;
      c = *str;
      do {
        iVar6 = pSVar17[lVar13].type;
        if (iVar6 == 0x106) {
          SVar7 = sqstd_rex_matchcclass(pSVar17[lVar13].left,c);
          if (SVar7 != 0) goto LAB_0012ebd1;
        }
        else if (iVar6 == 0x108) {
          if ((pSVar17[lVar13].left <= (long)c) && ((long)c <= pSVar17[lVar13].right)) {
LAB_0012ebd1:
            iVar6 = 0x105;
            goto LAB_0012ebd6;
          }
        }
        else if (iVar6 == c) goto LAB_0012ebd1;
        iVar6 = 0x107;
        if ((pSVar17 == (SQRexNode *)0x0) || (lVar13 = pSVar17[lVar13].next, lVar13 == -1))
        goto LAB_0012ebd6;
      } while( true );
    }
    goto LAB_0012ebc9;
  case 0x106:
    if (exp->_eol != str) {
      pSVar9 = (SQChar *)sqstd_rex_matchcclass(node->left,*str);
      str = str + 1;
      bVar18 = pSVar9 == (SQChar *)0x0;
      goto LAB_0012eb76;
    }
    goto LAB_0012ebc9;
  default:
    if (exp->_eol != str) {
      iVar6 = (int)*str;
LAB_0012ebd6:
      str = str + 1;
      bVar18 = iVar5 == iVar6;
      goto LAB_0012ec37;
    }
    goto LAB_0012ebc9;
  case 0x10a:
    bVar18 = exp->_eol == str;
    goto LAB_0012ec37;
  case 0x10b:
    bVar18 = exp->_bol == str;
    goto LAB_0012ec37;
  case 0x10c:
    if (((exp->_bol != str) || (iVar5 = isspace((int)*str), iVar5 != 0)) &&
       ((exp->_eol != str || (iVar5 = isspace((int)str[-1]), iVar5 != 0)))) {
      iVar5 = isspace((int)*str);
      if (iVar5 == 0) {
        iVar5 = isspace((int)str[1]);
        if (iVar5 == 0) goto LAB_0012e85c;
      }
      else {
        iVar5 = isspace((int)str[1]);
        if (iVar5 != 0) {
LAB_0012e85c:
          pSVar9 = (SQChar *)0x0;
          bVar18 = node->left == 0x62;
LAB_0012eb76:
          if (!bVar18) {
            return str;
          }
          return pSVar9;
        }
      }
    }
    bVar18 = node->left == 0x62;
LAB_0012ec37:
    pSVar9 = (SQChar *)0x0;
    if (bVar18) {
      pSVar9 = str;
    }
    break;
  case 0x10d:
    if (node->left == (long)*str) {
      pcVar12 = str + 1;
      if (pcVar12 < exp->_eol) {
        lVar13 = 1;
        do {
          if (node->right == (long)*pcVar12) {
            lVar13 = lVar13 + -1;
            if (lVar13 == 0) {
              return pcVar12 + 1;
            }
          }
          else {
            lVar13 = lVar13 + (ulong)(node->left == (long)*pcVar12);
          }
          pcVar12 = pcVar12 + 1;
        } while (pcVar12 != exp->_eol);
        return (SQChar *)0x0;
      }
    }
LAB_0012ebc9:
    pSVar9 = (SQChar *)0x0;
  }
  return pSVar9;
}

Assistant:

static const SQChar *sqstd_rex_matchnode(SQRex* exp,SQRexNode *node,const SQChar *str,SQRexNode *next)
{

    SQRexNodeType type = node->type;
    switch(type) {
    case OP_GREEDY: {
        //SQRexNode *greedystop = (node->next != -1) ? &exp->_nodes[node->next] : NULL;
        SQRexNode *greedystop = NULL;
        SQInteger p0 = (node->right >> 16)&0x0000FFFF, p1 = node->right&0x0000FFFF, nmaches = 0;
        const SQChar *s=str, *good = str;

        if(node->next != -1) {
            greedystop = &exp->_nodes[node->next];
        }
        else {
            greedystop = next;
        }

        while((nmaches == 0xFFFF || nmaches < p1)) {

            const SQChar *stop;
            if(!(s = sqstd_rex_matchnode(exp,&exp->_nodes[node->left],s,greedystop)))
                break;
            nmaches++;
            good=s;
            if(greedystop) {
                //checks that 0 matches satisfy the expression(if so skips)
                //if not would always stop(for instance if is a '?')
                if(greedystop->type != OP_GREEDY ||
                (greedystop->type == OP_GREEDY && ((greedystop->right >> 16)&0x0000FFFF) != 0))
                {
                    SQRexNode *gnext = NULL;
                    if(greedystop->next != -1) {
                        gnext = &exp->_nodes[greedystop->next];
                    }else if(next && next->next != -1){
                        gnext = &exp->_nodes[next->next];
                    }
                    stop = sqstd_rex_matchnode(exp,greedystop,s,gnext);
                    if(stop) {
                        //if satisfied stop it
                        if(p0 == p1 && p0 == nmaches) break;
                        else if(nmaches >= p0 && p1 == 0xFFFF) break;
                        else if(nmaches >= p0 && nmaches <= p1) break;
                    }
                }
            }

            if(s >= exp->_eol)
                break;
        }
        if(p0 == p1 && p0 == nmaches) return good;
        else if(nmaches >= p0 && p1 == 0xFFFF) return good;
        else if(nmaches >= p0 && nmaches <= p1) return good;
        return NULL;
    }
    case OP_OR: {
            const SQChar *asd = str;
            SQRexNode *temp=&exp->_nodes[node->left];
            while( (asd = sqstd_rex_matchnode(exp,temp,asd,NULL)) ) {
                if(temp->next != -1)
                    temp = &exp->_nodes[temp->next];
                else
                    return asd;
            }
            asd = str;
            temp = &exp->_nodes[node->right];
            while( (asd = sqstd_rex_matchnode(exp,temp,asd,NULL)) ) {
                if(temp->next != -1)
                    temp = &exp->_nodes[temp->next];
                else
                    return asd;
            }
            return NULL;
            break;
    }
    case OP_EXPR:
    case OP_NOCAPEXPR:{
            SQRexNode *n = &exp->_nodes[node->left];
            const SQChar *cur = str;
            SQInteger capture = -1;
            if(node->type != OP_NOCAPEXPR && node->right == exp->_currsubexp) {
                capture = exp->_currsubexp;
                exp->_matches[capture].begin = cur;
                exp->_currsubexp++;
            }
            SQInteger tempcap = exp->_currsubexp;
            do {
                SQRexNode *subnext = NULL;
                if(n->next != -1) {
                    subnext = &exp->_nodes[n->next];
                }else {
                    subnext = next;
                }
                if(!(cur = sqstd_rex_matchnode(exp,n,cur,subnext))) {
                    if(capture != -1){
                        exp->_matches[capture].begin = 0;
                        exp->_matches[capture].len = 0;
                    }
                    return NULL;
                }
            } while((n->next != -1) && (n = &exp->_nodes[n->next]));

            exp->_currsubexp = tempcap;
            if(capture != -1)
                exp->_matches[capture].len = cur - exp->_matches[capture].begin;
            return cur;
    }
    case OP_WB:
        if((str == exp->_bol && !isspace(*str))
         || (str == exp->_eol && !isspace(*(str-1)))
         || (!isspace(*str) && isspace(*(str+1)))
         || (isspace(*str) && !isspace(*(str+1))) ) {
            return (node->left == 'b')?str:NULL;
        }
        return (node->left == 'b')?NULL:str;
    case OP_BOL:
        if(str == exp->_bol) return str;
        return NULL;
    case OP_EOL:
        if(str == exp->_eol) return str;
        return NULL;
    case OP_DOT:{
        if (str == exp->_eol) return NULL;
        str++;
                }
        return str;
    case OP_NCLASS:
    case OP_CLASS:
        if (str == exp->_eol) return NULL;
        if(sqstd_rex_matchclass(exp,&exp->_nodes[node->left],*str)?(type == OP_CLASS?SQTrue:SQFalse):(type == OP_NCLASS?SQTrue:SQFalse)) {
            str++;
            return str;
        }
        return NULL;
    case OP_CCLASS:
        if (str == exp->_eol) return NULL;
        if(sqstd_rex_matchcclass(node->left,*str)) {
            str++;
            return str;
        }
        return NULL;
    case OP_MB:
        {
            SQInteger cb = node->left; //char that opens a balanced expression
            if(*str != cb) return NULL; // string doesnt start with open char
            SQInteger ce = node->right; //char that closes a balanced expression
            SQInteger cont = 1;
            const SQChar *streol = exp->_eol;
            while (++str < streol) {
              if (*str == ce) {
                if (--cont == 0) {
                    return ++str;
                }
              }
              else if (*str == cb) cont++;
            }
        }
        return NULL; // string ends out of balance
    default: /* char */
        if (str == exp->_eol) return NULL;
        if(*str != node->type) return NULL;
        str++;
        return str;
    }
    return NULL;
}